

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::
sync_call<void(libtorrent::aux::session_impl::*)(libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>),libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,entry **a,
          bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void> *a_1)

{
  bool bVar1;
  element_type *peVar2;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  undefined1 auVar3 [12];
  undefined1 local_b8 [8];
  undefined1 local_b0 [48];
  entry *local_80;
  undefined4 local_78;
  exception_ptr local_70;
  exception_ptr ex;
  bool done;
  error_code_enum local_54;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void> *a_local_1;
  entry **a_local;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_R8;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_50);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (!bVar1) {
    local_54 = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_54);
  }
  ex._M_exception_object._3_1_ = 0;
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_70);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  ctx = libtorrent::aux::session_impl::get_context(peVar2);
  local_b0._0_8_ = (long)&ex._M_exception_object + 3;
  local_b0._8_8_ = &local_70;
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)(local_b0 + 0x10),
             (shared_ptr<libtorrent::aux::session_impl> *)local_50);
  local_80 = *(entry **)a_1;
  local_78 = *(undefined4 *)
              &(s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base;
  local_b0._32_8_ = f;
  local_b0._40_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call<void(libtorrent::aux::session_impl::*)(libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>),libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>const&>(void(libtorrent::aux::session_impl::*)(libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>),libtorrent::bdecode_node_const*&&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>const&)const::_lambda()_1_>
            (ctx,(type *)local_b0,(type *)0x0);
  const::{lambda()#1}::~sync_call((_lambda___1_ *)local_b0);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_50);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 3),peVar2);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_70);
    ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
              ((shared_ptr<libtorrent::aux::session_impl> *)local_50);
    return;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_b8,&local_70);
  auVar3 = ::std::rethrow_exception((exception_ptr)local_b8);
  ex._M_exception_object._4_4_ = auVar3._8_4_;
  const::{lambda()#1}::~sync_call((_lambda___1_ *)local_b0);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_70);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_50);
  _Unwind_Resume(auVar3._0_8_);
}

Assistant:

void session_handle::sync_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;

		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
	}